

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_ffmpeg.c
# Opt level: O0

int ffmpeg_set_channel_map(input_handle *ih,int *st)

{
  byte bVar1;
  uint local_24;
  int bit_counter;
  uint channel_map_index;
  int *st_local;
  input_handle *ih_local;
  
  if (ih->codec_context->channel_layout == 0) {
    ih_local._4_4_ = 1;
  }
  else {
    local_24 = 0;
    bVar1 = 0;
    while (local_24 < (uint)ih->codec_context->channels) {
      if ((ih->codec_context->channel_layout & (long)(1 << (bVar1 & 0x1f))) != 0) {
        switch(1 << (bVar1 & 0x1f)) {
        case 1:
          st[local_24] = 1;
          break;
        case 2:
          st[local_24] = 2;
          break;
        default:
          st[local_24] = 0;
          break;
        case 4:
          st[local_24] = 3;
          break;
        case 0x10:
          st[local_24] = 4;
          break;
        case 0x20:
          st[local_24] = 5;
        }
        local_24 = local_24 + 1;
      }
      bVar1 = bVar1 + 1;
    }
    ih_local._4_4_ = 0;
  }
  return ih_local._4_4_;
}

Assistant:

static int
ffmpeg_set_channel_map(struct input_handle *ih, int *st)
{
	if (!ih->codec_context->channel_layout) {
		return 1;
	}

	unsigned int channel_map_index = 0;
	int bit_counter = 0;
	while (channel_map_index < (unsigned)ih->codec_context->channels) {
		if (ih->codec_context->channel_layout & (1 << bit_counter)) {
			switch (1 << bit_counter) {
			case AV_CH_FRONT_LEFT:
				st[channel_map_index] = EBUR128_LEFT;
				break;
			case AV_CH_FRONT_RIGHT:
				st[channel_map_index] = EBUR128_RIGHT;
				break;
			case AV_CH_FRONT_CENTER:
				st[channel_map_index] = EBUR128_CENTER;
				break;
			case AV_CH_BACK_LEFT:
				st[channel_map_index] = EBUR128_LEFT_SURROUND;
				break;
			case AV_CH_BACK_RIGHT:
				st[channel_map_index] = EBUR128_RIGHT_SURROUND;
				break;
			default:
				st[channel_map_index] = EBUR128_UNUSED;
				break;
			}
			++channel_map_index;
		}
		++bit_counter;
	}

	return 0;
}